

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethernet.cpp
# Opt level: O2

vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
* __thiscall
license::hw_identifier::Ethernet::alternative_ids
          (vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
           *__return_storage_ptr__,Ethernet *this)

{
  ulong uVar1;
  bool bVar2;
  pointer paVar3;
  pointer paVar4;
  FUNCTION_RETURN FVar5;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy;
  uchar *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uchar uVar10;
  uchar *puVar11;
  uchar *puVar12;
  anon_struct_1044_5_0902c47b *it;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  *this_00;
  pointer paVar13;
  uchar *puVar14;
  pointer data_00;
  bool bVar15;
  value_type local_87;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  *local_80;
  vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_> data;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> adapters;
  
  data.
  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.
  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.
  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = this->use_ip;
  adapters.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  adapters.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  adapters.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = __return_storage_ptr__;
  FVar5 = os::getAdapterInfos(&adapters);
  paVar4 = adapters.
           super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (FVar5 == FUNC_RET_OK) {
    if (adapters.
        super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        adapters.
        super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar1 = (ulong)(bVar2 ^ 1) * 2 + 4;
      puVar12 = (adapters.
                 super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start)->mac_address;
      puVar14 = (adapters.
                 super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start)->ipv4_address;
      for (paVar13 = adapters.
                     super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start; paVar13 != paVar4;
          paVar13 = paVar13 + 1) {
        local_87._M_elems[5] = '\0';
        local_87._M_elems[6] = '\0';
        local_87._M_elems[1] = '\0';
        local_87._M_elems[2] = '\0';
        local_87._M_elems[3] = '\0';
        local_87._M_elems[4] = '\0';
        bVar15 = true;
        uVar8 = 0;
        puVar6 = puVar12;
        while ((uVar8 < uVar1 && (bVar15))) {
          puVar11 = puVar6 + 6;
          if (bVar2 == false) {
            puVar11 = puVar6;
          }
          bVar15 = *puVar11 == '\0';
          uVar8 = uVar8 + 1;
          puVar6 = puVar6 + 1;
        }
        if (!bVar15) {
          lVar9 = 1;
          for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
            uVar10 = '*';
            if (lVar9 - 1U < uVar1) {
              puVar6 = puVar12;
              if (bVar2 != false) {
                puVar6 = puVar14;
              }
              uVar10 = puVar6[lVar7];
            }
            local_87._M_elems[lVar7 + 1] = uVar10;
            lVar9 = lVar9 + 1;
          }
          local_87._M_elems[0] = '\0';
          std::
          vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>::
          push_back(&data,&local_87);
        }
        puVar12 = puVar12 + 0x414;
        puVar14 = puVar14 + 0x414;
      }
      std::_Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::
      ~_Vector_base(&adapters.
                     super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                   );
      this_00 = local_80;
      (local_80->
      super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_80->
      super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_80->
      super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
      ::reserve(local_80,((long)data.
                                super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)data.
                               super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 7);
      paVar3 = data.
               super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (data_00 = data.
                     super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; data_00 != paVar3;
          data_00 = data_00 + 1) {
        HwIdentifier::HwIdentifier((HwIdentifier *)&adapters);
        strategy = (*(this->super_IdentificationStrategy)._vptr_IdentificationStrategy[2])(this);
        HwIdentifier::set_identification_strategy((HwIdentifier *)&adapters,strategy);
        HwIdentifier::set_data((HwIdentifier *)&adapters,data_00);
        std::
        vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
        ::push_back(this_00,(HwIdentifier *)&adapters);
        HwIdentifier::~HwIdentifier((HwIdentifier *)&adapters);
      }
      goto LAB_00198641;
    }
  }
  std::_Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::
  ~_Vector_base(&adapters.
                 super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
               );
  (local_80->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_80->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_80->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = local_80;
LAB_00198641:
  std::
  _Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>::
  ~_Vector_base(&data.
                 super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
               );
  return this_00;
}

Assistant:

std::vector<HwIdentifier> Ethernet::alternative_ids() const {
	vector<array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA>> data;
	FUNCTION_RETURN result = generate_ethernet_pc_id(data, use_ip);
	vector<HwIdentifier> identifiers;
	if (result == FUNC_RET_OK) {
		identifiers.reserve(data.size());
		for (auto &it : data) {
			HwIdentifier pc_id;
			pc_id.set_identification_strategy(identification_strategy());
			pc_id.set_data(it);
			identifiers.push_back(pc_id);
		}
	}
	return identifiers;
}